

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

int IDAEwtSet(N_Vector ycur,N_Vector weight,void *data)

{
  IDAMem in_RDX;
  int flag;
  IDAMem IDA_mem;
  int iVar1;
  
  iVar1 = 0;
  if (in_RDX->ida_itol == 1) {
    iVar1 = IDAEwtSetSS(in_RDX,(N_Vector)in_RDX,(N_Vector)0x1);
  }
  else if (in_RDX->ida_itol == 2) {
    iVar1 = IDAEwtSetSV(in_RDX,(N_Vector)in_RDX,(N_Vector)0x2);
  }
  return iVar1;
}

Assistant:

int IDAEwtSet(N_Vector ycur, N_Vector weight, void* data)
{
  IDAMem IDA_mem;
  int flag = 0;

  /* data points to IDA_mem here */

  IDA_mem = (IDAMem)data;

  switch (IDA_mem->ida_itol)
  {
  case IDA_SS: flag = IDAEwtSetSS(IDA_mem, ycur, weight); break;
  case IDA_SV: flag = IDAEwtSetSV(IDA_mem, ycur, weight); break;
  }
  return (flag);
}